

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

int parse_bag_attributes(CBS *attrs,uint8_t **out_friendly_name,size_t *out_friendly_name_len)

{
  int iVar1;
  size_t sVar2;
  uint32_t local_9c;
  undefined1 local_98 [4];
  uint32_t c;
  CBB cbb;
  CBS value;
  CBS values;
  CBS oid;
  CBS attr;
  size_t *out_friendly_name_len_local;
  uint8_t **out_friendly_name_local;
  CBS *attrs_local;
  
  *out_friendly_name = (uint8_t *)0x0;
  *out_friendly_name_len = 0;
  while( true ) {
    do {
      sVar2 = CBS_len(attrs);
      if (sVar2 == 0) {
        return 1;
      }
      iVar1 = CBS_get_asn1(attrs,(CBS *)&oid.len,0x20000010);
      if ((((iVar1 == 0) || (iVar1 = CBS_get_asn1((CBS *)&oid.len,(CBS *)&values.len,6), iVar1 == 0)
           ) || (iVar1 = CBS_get_asn1((CBS *)&oid.len,(CBS *)&value.len,0x20000011), iVar1 == 0)) ||
         (sVar2 = CBS_len((CBS *)&oid.len), sVar2 != 0)) {
        ERR_put_error(0x13,0,100,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,0x118);
        goto LAB_007492cb;
      }
      iVar1 = CBS_mem_equal((CBS *)&values.len,kFriendlyName,9);
    } while (iVar1 == 0);
    if (((*out_friendly_name != (uint8_t *)0x0) ||
        (iVar1 = CBS_get_asn1((CBS *)&value.len,(CBS *)((long)&cbb.u + 0x18),0x1e), iVar1 == 0)) ||
       ((sVar2 = CBS_len((CBS *)&value.len), sVar2 != 0 ||
        (sVar2 = CBS_len((CBS *)((long)&cbb.u + 0x18)), sVar2 == 0)))) break;
    sVar2 = CBS_len((CBS *)((long)&cbb.u + 0x18));
    iVar1 = CBB_init((CBB *)local_98,sVar2);
    if (iVar1 == 0) goto LAB_007492cb;
    while (sVar2 = CBS_len((CBS *)((long)&cbb.u + 0x18)), sVar2 != 0) {
      iVar1 = CBS_get_ucs2_be((CBS *)((long)&cbb.u + 0x18),&local_9c);
      if ((iVar1 == 0) || (iVar1 = CBB_add_utf8((CBB *)local_98,local_9c), iVar1 == 0)) {
        ERR_put_error(0x13,0,0x83,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,300);
        CBB_cleanup((CBB *)local_98);
        goto LAB_007492cb;
      }
    }
    iVar1 = CBB_finish((CBB *)local_98,out_friendly_name,out_friendly_name_len);
    if (iVar1 == 0) {
      CBB_cleanup((CBB *)local_98);
LAB_007492cb:
      OPENSSL_free(*out_friendly_name);
      *out_friendly_name = (uint8_t *)0x0;
      *out_friendly_name_len = 0;
      return 0;
    }
  }
  ERR_put_error(0x13,0,100,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                ,0x121);
  goto LAB_007492cb;
}

Assistant:

static int parse_bag_attributes(CBS *attrs, uint8_t **out_friendly_name,
                                size_t *out_friendly_name_len) {
  *out_friendly_name = NULL;
  *out_friendly_name_len = 0;

  // See https://tools.ietf.org/html/rfc7292#section-4.2.
  while (CBS_len(attrs) != 0) {
    CBS attr, oid, values;
    if (!CBS_get_asn1(attrs, &attr, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&attr, &oid, CBS_ASN1_OBJECT) ||
        !CBS_get_asn1(&attr, &values, CBS_ASN1_SET) || CBS_len(&attr) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }
    if (CBS_mem_equal(&oid, kFriendlyName, sizeof(kFriendlyName))) {
      // See https://tools.ietf.org/html/rfc2985, section 5.5.1.
      CBS value;
      if (*out_friendly_name != NULL ||
          !CBS_get_asn1(&values, &value, CBS_ASN1_BMPSTRING) ||
          CBS_len(&values) != 0 || CBS_len(&value) == 0) {
        OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
        goto err;
      }
      // Convert the friendly name to UTF-8.
      CBB cbb;
      if (!CBB_init(&cbb, CBS_len(&value))) {
        goto err;
      }
      while (CBS_len(&value) != 0) {
        uint32_t c;
        if (!CBS_get_ucs2_be(&value, &c) || !CBB_add_utf8(&cbb, c)) {
          OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_INVALID_CHARACTERS);
          CBB_cleanup(&cbb);
          goto err;
        }
      }
      if (!CBB_finish(&cbb, out_friendly_name, out_friendly_name_len)) {
        CBB_cleanup(&cbb);
        goto err;
      }
    }
  }

  return 1;

err:
  OPENSSL_free(*out_friendly_name);
  *out_friendly_name = NULL;
  *out_friendly_name_len = 0;
  return 0;
}